

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsaz_exp.h
# Opt level: O0

int rsaz_avx2_preferred(void)

{
  int iVar1;
  
  iVar1 = CRYPTO_is_BMI1_capable();
  if (((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) &&
     (iVar1 = CRYPTO_is_ADX_capable(), iVar1 != 0)) {
    return 0;
  }
  iVar1 = CRYPTO_is_AVX2_capable();
  return iVar1;
}

Assistant:

inline int rsaz_avx2_preferred(void) {
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    // If BMI1, BMI2, and ADX are available, x86_64-mont5.pl is faster. See the
    // .Lmulx4x_enter and .Lpowerx5_enter branches.
    return 0;
  }
  return CRYPTO_is_AVX2_capable();
}